

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

void SetTiming(int onoff,int myid)

{
  int in_ESI;
  int in_EDI;
  timespec spec;
  int local_1c;
  timespec local_18;
  int local_8;
  int local_4;
  
  local_8 = in_ESI;
  local_4 = in_EDI;
  clock_gettime(1,&local_18);
  base_time_tv_sec = local_18.tv_sec;
  clock_getres(1,&local_18);
  if (local_8 == 0) {
    printf("Timer resolution: %ld ns = %g s\n",(double)local_18.tv_nsec / 1000000000.0,
           local_18.tv_nsec);
  }
  if (local_8 == 0) {
    local_1c = local_4;
  }
  else {
    local_1c = 0;
  }
  print_time = local_1c;
  return;
}

Assistant:

void SetTiming(int onoff, int myid)
{
#if defined(SUNDIALS_HAVE_POSIX_TIMERS) && defined(_POSIX_TIMERS)
  struct timespec spec;
  clock_gettime(CLOCK_MONOTONIC, &spec);
  base_time_tv_sec = spec.tv_sec;

  clock_getres(CLOCK_MONOTONIC, &spec);
  if (myid == 0)
  {
    printf("Timer resolution: %ld ns = %g s\n", spec.tv_nsec,
           ((double)(spec.tv_nsec) / 1E9));
  }
#endif

  /* only print from the root process */
  print_time = (myid == 0) ? onoff : 0;
}